

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O1

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ExportObj(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            *this,int i)

{
  pointer __src;
  size_t __n;
  size_t sVar1;
  BasicMemoryWriter<char,_std::allocator<char>_> *pBVar2;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *pPVar3;
  Buffer<char> *pBVar4;
  int iVar5;
  undefined4 extraout_var;
  string *psVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  VarNamer vnam;
  char *str;
  char *pcVar7;
  ptrdiff_t _Num;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ExprBase nonlinear;
  char *str_1;
  ulong uVar11;
  size_t new_size;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MemoryWriter w2;
  MemoryWriter wrt;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4d8;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *local_4c0;
  int local_4b4;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4b0;
  long local_4a0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_498;
  undefined1 local_488 [8];
  Buffer<char> *pBStack_480;
  Buffer<char> local_478;
  undefined8 local_458;
  char cStack_450;
  BasicMemoryWriter<char,_std::allocator<char>_> local_258;
  undefined4 extraout_var_02;
  
  iVar5 = (*(((this->flat_cvt_).
              super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              .super_FlatModel<mp::DefaultFlatModelParams>.super_ConstraintManager.
              graph_exporter_app_._M_t.
              super___uniq_ptr_impl<mp::BasicFileAppender,_std::default_delete<mp::BasicFileAppender>_>
              ._M_t.
              super__Tuple_impl<0UL,_mp::BasicFileAppender_*,_std::default_delete<mp::BasicFileAppender>_>
              .super__Head_base<0UL,_mp::BasicFileAppender_*,_false>._M_head_impl)->
            super_BasicLogger)._vptr_BasicLogger[2])();
  if ((char)iVar5 != '\0') {
    local_258.super_BasicWriter<char>.buffer_ = &local_258.buffer_.super_Buffer<char>;
    local_258.super_BasicWriter<char>._vptr_BasicWriter =
         (_func_int **)&PTR__BasicMemoryWriter_005c2730;
    local_258.buffer_.super_Buffer<char>.ptr_ = local_258.buffer_.data_;
    local_258.buffer_.super_Buffer<char>.size_ = 0;
    local_258.buffer_.super_Buffer<char>.capacity_ = 500;
    local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c2798;
    local_498.wrt_ = &local_258;
    local_498.kind_ = Unset;
    local_498.n_written_ = 0;
    key._M_str = (char *)0x12;
    key._M_len = (size_t)&local_498;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_4d8,key)
    ;
    if (local_4d8.kind_ == Unset) {
      local_4d8.kind_ = Scalar;
    }
    local_488 = (undefined1  [8])(ulong)(uint)i;
    fmt::BasicWriter<char>::write
              (&(local_4d8.wrt_)->super_BasicWriter<char>,0x4b9e95,(void *)0x2,(size_t)local_488);
    local_4d8.n_written_ = local_4d8.n_written_ + 1;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
    iVar5 = (*(this->
              super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              ).
              super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              .
              super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
              ._vptr_BasicExprVisitor[0x12])(this);
    lVar9 = CONCAT44(extraout_var,iVar5);
    psVar6 = BasicProblem<mp::BasicProblemParams<int>_>::item_name
                       (i,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(lVar9 + 0x150),
                        (int)((ulong)(*(long *)(lVar9 + 0x200) - *(long *)(lVar9 + 0x1f8)) >> 3) *
                        -0x11111111,"_OBJ",0x7fffffff,(char *)0x0);
    key_00._M_str = (char *)0x4;
    key_00._M_len = (size_t)&local_498;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)local_488,
               key_00);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::
    DoWriteString<std::__cxx11::string>
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)local_488,psVar6
              );
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)local_488);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)local_488);
    local_4c0 = this;
    iVar5 = (*(this->
              super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              ).
              super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              .
              super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
              ._vptr_BasicExprVisitor[0x12])(this);
    local_4a0 = CONCAT44(extraout_var_00,iVar5);
    uVar11 = (ulong)i;
    uVar10 = uVar11 + 0x3f;
    if (-1 < (long)uVar11) {
      uVar10 = uVar11;
    }
    lVar9 = ((long)uVar10 >> 6) * 8;
    uVar8 = (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001);
    uVar10 = *(ulong *)(*(long *)(local_4a0 + 0x1d0) + lVar9 + -8 + uVar8 * 8);
    key_01._M_str = (char *)0x5;
    key_01._M_len = (size_t)&local_498;
    local_4b4 = i;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (&local_4d8,key_01);
    if (local_4d8.kind_ == Unset) {
      local_4d8.kind_ = Scalar;
    }
    local_488 = (undefined1  [8])(ulong)((uVar10 >> (i & 0x3fU) & 1) != 0);
    fmt::BasicWriter<char>::write
              (&(local_4d8.wrt_)->super_BasicWriter<char>,0x4b9e95,(void *)0x2,(size_t)local_488);
    local_4d8.n_written_ = local_4d8.n_written_ + 1;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
    pBStack_480 = &local_478;
    local_488 = (undefined1  [8])&PTR__BasicMemoryWriter_005c2730;
    local_478.ptr_ = (char *)&local_458;
    local_478.capacity_ = 500;
    local_478._vptr_Buffer = (_func_int **)&PTR_grow_005c2798;
    pcVar7 = "maximize ";
    if ((*(ulong *)(uVar8 * 8 + -8 + lVar9 + *(long *)(local_4a0 + 0x1d0)) &
        1L << (sbyte)(i & 0x3fU)) == 0) {
      pcVar7 = "minimize ";
    }
    cStack_450 = pcVar7[8];
    local_458 = *(undefined8 *)pcVar7;
    local_478.size_ = 9;
    iVar5 = (*(local_4c0->
              super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              ).
              super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              .
              super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
              ._vptr_BasicExprVisitor[0x12])();
    lVar9 = CONCAT44(extraout_var_01,iVar5);
    psVar6 = BasicProblem<mp::BasicProblemParams<int>_>::item_name
                       (local_4b4,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(lVar9 + 0x150),
                        (int)((ulong)(*(long *)(lVar9 + 0x200) - *(long *)(lVar9 + 0x1f8)) >> 3) *
                        -0x11111111,"_OBJ",0x7fffffff,(char *)0x0);
    pBVar4 = pBStack_480;
    __src = (psVar6->_M_dataplus)._M_p;
    __n = psVar6->_M_string_length;
    uVar10 = pBStack_480->size_ + __n;
    if (pBStack_480->capacity_ < uVar10) {
      (**pBStack_480->_vptr_Buffer)(pBStack_480,uVar10);
    }
    if (__n != 0) {
      memmove(pBVar4->ptr_ + pBVar4->size_,__src,__n);
    }
    pBVar4->size_ = uVar10;
    pBVar4 = pBStack_480;
    uVar10 = pBStack_480->size_ + 2;
    if (pBStack_480->capacity_ < uVar10) {
      (**pBStack_480->_vptr_Buffer)(pBStack_480,uVar10);
    }
    pcVar7 = pBVar4->ptr_;
    sVar1 = pBVar4->size_;
    (pcVar7 + sVar1)[0] = ':';
    (pcVar7 + sVar1)[1] = ' ';
    pBVar4->size_ = uVar10;
    if (uVar11 < (ulong)(*(long *)(local_4a0 + 0x218) - *(long *)(local_4a0 + 0x210) >> 3)) {
      nonlinear.impl_ = *(Impl **)(*(long *)(local_4a0 + 0x210) + uVar11 * 8);
    }
    else {
      nonlinear.impl_ = (Impl *)0x0;
    }
    lVar9 = *(long *)(local_4a0 + 0x1f8);
    vnam.p_._0_4_ =
         (*(local_4c0->
           super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
           ).
           super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
           .
           super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
           ._vptr_BasicExprVisitor[0x12])();
    vnam.p_._4_4_ = extraout_var_02;
    WriteExpr<mp::internal::ExprTypes,mp::LinearExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
              ((Writer *)local_488,(LinearExpr *)(uVar11 * 0x78 + lVar9),
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)nonlinear.impl_,vnam);
    sVar1 = pBStack_480->size_;
    if (pBStack_480->capacity_ < sVar1 + 1) {
      (**pBStack_480->_vptr_Buffer)();
    }
    pBStack_480->ptr_[sVar1] = '\0';
    pBVar2 = (BasicMemoryWriter<char,_std::allocator<char>_> *)pBStack_480->ptr_;
    key_02._M_str = (char *)0x7;
    key_02._M_len = (size_t)&local_498;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (&local_4b0,key_02);
    if (local_4b0.kind_ == Unset) {
      local_4b0.kind_ = Scalar;
    }
    local_4d8.wrt_ = pBVar2;
    fmt::BasicWriter<char>::write
              (&(local_4b0.wrt_)->super_BasicWriter<char>,0x49f13a,(void *)0xa,(size_t)&local_4d8);
    local_4b0.n_written_ = local_4b0.n_written_ + 1;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b0);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b0);
    pPVar3 = local_4c0;
    local_488 = (undefined1  [8])&PTR__BasicMemoryWriter_005c2730;
    local_478._vptr_Buffer = (_func_int **)&PTR_grow_005c2798;
    if (local_478.ptr_ != (char *)&local_458) {
      operator_delete(local_478.ptr_,local_478.capacity_);
    }
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_498);
    local_488 = (undefined1  [8])0x0;
    pBStack_480 = (Buffer<char> *)0x0;
    fmt::BasicWriter<char>::write
              (&local_258.super_BasicWriter<char>,0x4b5be3,(void *)0x0,(size_t)local_488);
    BasicFileAppender::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>
              ((pPVar3->flat_cvt_).
               super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               .super_FlatModel<mp::DefaultFlatModelParams>.super_ConstraintManager.
               graph_exporter_app_._M_t.
               super___uniq_ptr_impl<mp::BasicFileAppender,_std::default_delete<mp::BasicFileAppender>_>
               ._M_t.
               super__Tuple_impl<0UL,_mp::BasicFileAppender_*,_std::default_delete<mp::BasicFileAppender>_>
               .super__Head_base<0UL,_mp::BasicFileAppender_*,_false>._M_head_impl,&local_258);
    local_258.super_BasicWriter<char>._vptr_BasicWriter =
         (_func_int **)&PTR__BasicMemoryWriter_005c2730;
    local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c2798;
    if (local_258.buffer_.super_Buffer<char>.ptr_ != local_258.buffer_.data_) {
      operator_delete(local_258.buffer_.super_Buffer<char>.ptr_,
                      local_258.buffer_.super_Buffer<char>.capacity_);
    }
  }
  return;
}

Assistant:

void ExportObj(int i) {
    if (GetFlatCvt().GetFileAppender().IsOpen()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["NL_OBJECTIVE_index"] = i;
        jw["name"] = GetModel().obj_name(i);
        auto obj = GetModel().obj(i);
        jw["sense"] = (int)obj.type();
        fmt::MemoryWriter w2;
        w2 << (obj::MAX==obj.type() ? "maximize " : "minimize ");
        w2 << GetModel().obj_name(i) << ": ";
        WriteExpr<typename ProblemType::ExprTypes>(
              w2, obj.linear_expr(), obj.nonlinear_expr(),
              GetModel().GetVarNamer());
        jw["printed"] = w2.c_str();
      }
      wrt.write("\n");                     // EOL
      GetFlatCvt().GetFileAppender().Append(wrt);
    }
  }